

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O1

int __thiscall QAccessibleTabBar::indexOfChild(QAccessibleTabBar *this,QAccessibleInterface *child)

{
  int iVar1;
  long lVar2;
  long lVar3;
  QAccessibleTabBar *pQVar4;
  QAccessibleTabBar *pQVar5;
  QTabBar *pQVar6;
  QAccessibleTabButton *tabButton;
  
  lVar2 = (**(code **)(*(long *)child + 0x18))(child);
  if (lVar2 != 0) {
    lVar2 = (**(code **)(*(long *)child + 0x18))(child);
    (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
    lVar3 = QMetaObject::cast((QObject *)&QTabBar::staticMetaObject);
    if (lVar2 == *(long *)(*(long *)(lVar3 + 8) + 0x290)) {
      (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
      pQVar6 = (QTabBar *)QMetaObject::cast((QObject *)&QTabBar::staticMetaObject);
      iVar1 = QTabBar::count(pQVar6);
      return iVar1;
    }
  }
  lVar2 = (**(code **)(*(long *)child + 0x18))(child);
  if (lVar2 != 0) {
    lVar2 = (**(code **)(*(long *)child + 0x18))(child);
    (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
    lVar3 = QMetaObject::cast((QObject *)&QTabBar::staticMetaObject);
    if (lVar2 == *(long *)(*(long *)(lVar3 + 8) + 0x288)) {
      (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
      pQVar6 = (QTabBar *)QMetaObject::cast((QObject *)&QTabBar::staticMetaObject);
      iVar1 = QTabBar::count(pQVar6);
      return iVar1 + 1;
    }
  }
  iVar1 = (**(code **)(*(long *)child + 0x78))(child);
  if (iVar1 == 0x25) {
    pQVar4 = (QAccessibleTabBar *)(**(code **)(*(long *)child + 0x40))(child);
    pQVar5 = pQVar4;
    if (pQVar4 == this) {
      pQVar5 = (QAccessibleTabBar *)(ulong)*(uint *)(child + 0x20);
    }
    if (pQVar4 == this) {
      return (int)pQVar5;
    }
  }
  return -1;
}

Assistant:

int QAccessibleTabBar::indexOfChild(const QAccessibleInterface *child) const
{
    if (child->object() && child->object() == tabBar()->d_func()->leftB)
        return tabBar()->count();
    if (child->object() && child->object() == tabBar()->d_func()->rightB)
        return tabBar()->count() + 1;
    if (child->role() == QAccessible::PageTab) {
        QAccessibleInterface *parent = child->parent();
        if (parent == this) {
            const QAccessibleTabButton *tabButton = static_cast<const QAccessibleTabButton *>(child);
            return tabButton->index();
        }
    }
    return -1;
}